

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_readfile(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  uint uVar2;
  int iVar3;
  jx9_io_stream *pStream;
  void *pvVar4;
  jx9_int64 jVar5;
  char *pcVar6;
  jx9_value *pjVar7;
  void *pvVar8;
  jx9_vm *pVm;
  char *zFile;
  int nLen;
  char zBuf [8192];
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar6 = "Expecting a file path";
LAB_0013d2e5:
    jx9VmThrowError(pVm,&pjVar1->sName,2,pcVar6);
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pVm = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pVm,&zFile,nLen);
    if (pStream == (jx9_io_stream *)0x0) {
      pjVar1 = pCtx->pFunc;
      pcVar6 = "No such stream device, JX9 is returning FALSE";
      goto LAB_0013d2e5;
    }
    if (nArg == 1) {
      iVar3 = 0;
LAB_0013d39a:
      pjVar7 = (jx9_value *)0x0;
    }
    else {
      pjVar7 = apArg[1];
      jx9MemObjToBool(pjVar7);
      iVar3 = *(int *)&pjVar7->x;
      pVm = pCtx->pVm;
      if ((uint)nArg < 3) goto LAB_0013d39a;
      pjVar7 = apArg[2];
    }
    pcVar6 = zFile;
    pvVar4 = jx9StreamOpenHandle(pVm,pStream,zFile,1,iVar3,pjVar7,0,(int *)0x0);
    if (pvVar4 != (void *)0x0) {
      jVar5 = (*pStream->xRead)(pvVar4,zBuf,0x2000);
      if (jVar5 < 1) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = (void *)0x0;
        do {
          iVar3 = jx9_context_output(pCtx,zBuf,(int)jVar5);
          if (iVar3 == -10) break;
          pvVar8 = (void *)((long)pvVar8 + jVar5);
          jVar5 = (*pStream->xRead)(pvVar4,zBuf,0x2000);
        } while (0 < jVar5);
      }
      if (pStream->xClose != (_func_void_void_ptr *)0x0) {
        (*pStream->xClose)(pvVar4);
      }
      pjVar7 = pCtx->pRet;
      jx9MemObjRelease(pjVar7);
      (pjVar7->x).pOther = pvVar8;
      uVar2 = 2;
      goto LAB_0013d307;
    }
    jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar6);
  }
  pjVar7 = pCtx->pRet;
  jx9MemObjRelease(pjVar7);
  (pjVar7->x).rVal = 0.0;
  uVar2 = 8;
LAB_0013d307:
  pjVar7->iFlags = pjVar7->iFlags & 0xfffffe90U | uVar2;
  return 0;
}

Assistant:

static int jx9Builtin_readfile(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int use_include  = FALSE;
	const jx9_io_stream *pStream;
	jx9_int64 n, nRead;
	const char *zFile;
	char zBuf[8192];
	void *pHandle;
	int rc, nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 1 ){
		use_include = jx9_value_to_bool(apArg[1]);
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, 
		use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nRead = 0;
	for(;;){
		n = pStream->xRead(pHandle, zBuf, sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error, break immediately */
			break;
		}
		/* Output data */
		rc = jx9_context_output(pCtx, zBuf, (int)n);
		if( rc == JX9_ABORT ){
			break;
		}
		/* Increment counter */
		nRead += n;
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Total number of bytes readen */
	jx9_result_int64(pCtx, nRead);
	return JX9_OK;
}